

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede3_unwrap(PROV_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  uchar *puVar2;
  ulong in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  uchar *in_stack_00000008;
  int rv;
  uchar sha1tmp [20];
  uchar iv [8];
  uchar icv [8];
  int local_5c;
  undefined1 local_58 [32];
  uchar local_38 [8];
  uchar local_30 [8];
  ulong local_28;
  uchar *local_20;
  uchar *local_18;
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_5c = -1;
  if (in_RCX < 0x18) {
    local_5c = -1;
  }
  else if (in_RSI == (uchar *)0x0) {
    local_5c = (int)in_RCX + -0x10;
  }
  else {
    *(uchar (*) [8])(in_RDI + 0x94) = (uchar  [8])0x521e8792ca2dd4a;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,local_30,in_RDX,8);
    if (local_18 == local_20) {
      memmove(local_18,local_18 + 8,local_28 - 8);
      local_20 = local_20 + -8;
    }
    (**(code **)(*(long *)(local_10 + 0xa8) + 8))(local_10,local_18,local_20 + 8,local_28 - 0x10);
    (**(code **)(*(long *)(local_10 + 0xa8) + 8))(local_10,local_38,local_20 + (local_28 - 8),8);
    BUF_reverse(local_30,(uchar *)0x0,8);
    BUF_reverse(local_18,(uchar *)0x0,local_28 - 0x10);
    BUF_reverse((uchar *)(local_10 + 0x94),local_38,8);
    (**(code **)(*(long *)(local_10 + 0xa8) + 8))(local_10,local_18,local_18,local_28 - 0x10);
    (**(code **)(*(long *)(local_10 + 0xa8) + 8))(local_10,local_30,local_30,8);
    puVar2 = ossl_sha1(in_stack_00000008,unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if ((puVar2 != (uchar *)0x0) && (iVar1 = CRYPTO_memcmp(local_58,local_30,8), iVar1 == 0)) {
      local_5c = (int)local_28 + -0x10;
    }
    OPENSSL_cleanse(local_30,8);
    OPENSSL_cleanse(local_58,0x14);
    OPENSSL_cleanse(local_38,8);
    OPENSSL_cleanse((void *)(local_10 + 0x94),0x10);
    if (local_5c == -1) {
      OPENSSL_cleanse(local_18,local_28 - 0x10);
    }
  }
  return local_5c;
}

Assistant:

static int des_ede3_unwrap(EVP_CIPHER_CTX *ctx, unsigned char *out,
                           const unsigned char *in, size_t inl)
{
    unsigned char icv[8], iv[8], sha1tmp[SHA_DIGEST_LENGTH];
    int rv = -1;
    if (inl < 24)
        return -1;
    if (out == NULL)
        return inl - 16;
    memcpy(ctx->iv, wrap_iv, 8);
    /* Decrypt first block which will end up as icv */
    des_ede_cbc_cipher(ctx, icv, in, 8);
    /* Decrypt central blocks */
    /*
     * If decrypting in place move whole output along a block so the next
     * des_ede_cbc_cipher is in place.
     */
    if (out == in) {
        memmove(out, out + 8, inl - 8);
        in -= 8;
    }
    des_ede_cbc_cipher(ctx, out, in + 8, inl - 16);
    /* Decrypt final block which will be IV */
    des_ede_cbc_cipher(ctx, iv, in + inl - 8, 8);
    /* Reverse order of everything */
    BUF_reverse(icv, NULL, 8);
    BUF_reverse(out, NULL, inl - 16);
    BUF_reverse(ctx->iv, iv, 8);
    /* Decrypt again using new IV */
    des_ede_cbc_cipher(ctx, out, out, inl - 16);
    des_ede_cbc_cipher(ctx, icv, icv, 8);
    if (ossl_sha1(out, inl - 16, sha1tmp)  /* Work out hash of first portion */
            && CRYPTO_memcmp(sha1tmp, icv, 8) == 0)
        rv = inl - 16;
    OPENSSL_cleanse(icv, 8);
    OPENSSL_cleanse(sha1tmp, SHA_DIGEST_LENGTH);
    OPENSSL_cleanse(iv, 8);
    OPENSSL_cleanse(ctx->iv, 8);
    if (rv == -1)
        OPENSSL_cleanse(out, inl - 16);

    return rv;
}